

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
ftxui::CellToGlyphIndex(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *input)

{
  size_t sVar1;
  bool bVar2;
  size_type __n;
  ulong uVar3;
  uint32_t local_44;
  bool eaten;
  size_t sStack_40;
  uint32_t codepoint;
  size_t end;
  size_t start;
  undefined1 local_1d;
  value_type local_1c;
  string *psStack_18;
  int x;
  string *input_local;
  vector<int,_std::allocator<int>_> *out;
  
  local_1c = -1;
  local_1d = 0;
  psStack_18 = input;
  input_local = (string *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  __n = std::__cxx11::string::size();
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,__n);
  end = 0;
  sStack_40 = 0;
  while (sVar1 = end, uVar3 = std::__cxx11::string::size(), sVar1 < uVar3) {
    local_44 = 0;
    bVar2 = EatCodePoint(psStack_18,end,&stack0xffffffffffffffc0,&local_44);
    end = sStack_40;
    if ((bVar2) && (bVar2 = IsControl(local_44), !bVar2)) {
      bVar2 = IsCombining(local_44);
      if (bVar2) {
        if (local_1c == -1) {
          local_1c = 0;
          std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
        }
      }
      else {
        bVar2 = IsFullWidth(local_44);
        if (bVar2) {
          local_1c = local_1c + 1;
          std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
          std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
        }
        else {
          local_1c = local_1c + 1;
          std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> CellToGlyphIndex(const std::string& input) {
  int x = -1;
  std::vector<int> out;
  out.reserve(input.size());
  size_t start = 0;
  size_t end = 0;
  while (start < input.size()) {
    uint32_t codepoint = 0;
    const bool eaten = EatCodePoint(input, start, &end, &codepoint);
    start = end;

    // Ignore invalid / control characters.
    if (!eaten || IsControl(codepoint)) {
      continue;
    }

    // Combining characters are put with the previous glyph they are modifying.
    if (IsCombining(codepoint)) {
      if (x == -1) {
        ++x;
        out.push_back(x);
      }
      continue;
    }

    // Fullwidth characters take two cells. The second is made of the empty
    // string to reserve the space the first is taking.
    if (IsFullWidth(codepoint)) {
      ++x;
      out.push_back(x);
      out.push_back(x);
      continue;
    }

    // Normal characters:
    ++x;
    out.push_back(x);
  }
  return out;
}